

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O1

int Sfm_ObjRef_rec(Sfm_Ntk_t *p,int iObj)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (iObj < p->nPis) {
    return 0;
  }
  if (p->nObjs <= p->nPos + iObj) {
    __assert_fail("Sfm_ObjIsNode(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmWin.c"
                  ,0x32,"int Sfm_ObjRef_rec(Sfm_Ntk_t *, int)");
  }
  if ((-1 < iObj) && (iObj < (p->vFanouts).nSize)) {
    pVVar1 = (p->vFanouts).pArray;
    iVar3 = pVVar1[(uint)iObj].nSize;
    pVVar1[(uint)iObj].nSize = iVar3 + 1;
    if (0 < iVar3) {
      return 0;
    }
    if (iVar3 != 0) {
      __assert_fail("Value == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmWin.c"
                    ,0x36,"int Sfm_ObjRef_rec(Sfm_Ntk_t *, int)");
    }
    if (iObj < (p->vFanins).nSize) {
      iVar3 = 1;
      lVar4 = 0;
      do {
        pVVar1 = (p->vFanins).pArray;
        if (pVVar1[(uint)iObj].nSize <= lVar4) {
          return iVar3;
        }
        if (pVVar1[(uint)iObj].nSize <= lVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = Sfm_ObjRef_rec(p,pVVar1[(uint)iObj].pArray[lVar4]);
        iVar3 = iVar3 + iVar2;
        lVar4 = lVar4 + 1;
      } while (iObj < (p->vFanins).nSize);
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the MFFC size.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Sfm_ObjRef_rec( Sfm_Ntk_t * p, int iObj )
{
    int i, iFanin, Value, Count;
    if ( Sfm_ObjIsPi(p, iObj) )
        return 0;
    assert( Sfm_ObjIsNode(p, iObj) );
    Value = Sfm_ObjRefIncrement(p, iObj);
    if ( Value > 1 )
        return 0;
    assert( Value == 1 );
    Count = 1;
    Sfm_ObjForEachFanin( p, iObj, iFanin, i )
        Count += Sfm_ObjRef_rec( p, iFanin );
    return Count;
}